

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev3dev.cpp
# Opt level: O2

ofstream * __thiscall ev3dev::anon_unknown_20::ofstream_open(anon_unknown_20 *this,string *path)

{
  _List_node_base *p_Var1;
  undefined8 *puVar2;
  __type _Var3;
  char cVar4;
  int iVar5;
  pointer p_Var6;
  _List_node_base *p_Var7;
  __allocated_ptr<std::allocator<std::_List_node<ev3dev::(anonymous_namespace)::lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_ofstream<char,_std::char_traits<char>_>_>::item>_>_>
  local_30;
  
  if ((anonymous_namespace)::ofstream_cache(std::__cxx11::string_const&)::cache_abi_cxx11_ == '\0')
  {
    iVar5 = __cxa_guard_acquire(&(anonymous_namespace)::ofstream_cache(std::__cxx11::string_const&)
                                 ::cache_abi_cxx11_);
    if (iVar5 != 0) {
      (anonymous_namespace)::ofstream_cache(std::__cxx11::string_const&)::cache_abi_cxx11_ = 0x10;
      path = (string *)
             &(anonymous_namespace)::ofstream_cache(std::__cxx11::string_const&)::cache_abi_cxx11_;
      DAT_0011dbc0 = &DAT_0011dbb8;
      DAT_0011dbb8 = (_List_node_base *)&DAT_0011dbb8;
      DAT_0011dbc8 = 0;
      __cxa_atexit(lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_ofstream<char,_std::char_traits<char>_>_>
                   ::~lru_cache,
                   &(anonymous_namespace)::ofstream_cache(std::__cxx11::string_const&)::
                    cache_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::ofstream_cache(std::__cxx11::string_const&)::
                           cache_abi_cxx11_);
    }
  }
  std::mutex::lock((mutex *)(anonymous_namespace)::ofstream_cache(std::__cxx11::string_const&)::mx);
  p_Var7 = (_List_node_base *)&DAT_0011dbb8;
  do {
    p_Var7 = p_Var7->_M_next;
    if (p_Var7 == (_List_node_base *)&DAT_0011dbb8) goto LAB_00110747;
    path = (string *)this;
    _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (p_Var7 + 1),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            this);
  } while (!_Var3);
  if (p_Var7->_M_next != DAT_0011dbb8 && DAT_0011dbb8 != p_Var7) {
    std::__detail::_List_node_base::_M_transfer(DAT_0011dbb8,p_Var7);
  }
LAB_001107bc:
  p_Var1 = DAT_0011dbb8;
  p_Var7 = DAT_0011dbb8 + 3;
  pthread_mutex_unlock
            ((pthread_mutex_t *)
             (anonymous_namespace)::ofstream_cache(std::__cxx11::string_const&)::mx);
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 == '\0') {
    (*(code *)p_Var1[3]._M_prev[1]._M_prev)(&p_Var1[3]._M_prev,0,0);
    std::ofstream::open((string *)p_Var7,(_Ios_Openmode)this);
  }
  else {
    std::ios::clear((int)p_Var7->_M_next[-2]._M_prev + (int)p_Var7);
  }
  return (ofstream *)p_Var7;
LAB_00110747:
  while (puVar2 = DAT_0011dbc0,
        (anonymous_namespace)::ofstream_cache(std::__cxx11::string_const&)::cache_abi_cxx11_ <
        DAT_0011dbc8 + 1U) {
    DAT_0011dbc8 = DAT_0011dbc8 + -1;
    std::__detail::_List_node_base::_M_unhook();
    std::
    allocator_traits<std::allocator<std::_List_node<ev3dev::(anonymous_namespace)::lru_cache<std::__cxx11::string,std::ofstream>::item>>>
    ::destroy<ev3dev::(anonymous_namespace)::lru_cache<std::__cxx11::string,std::ofstream>::item>
              ((allocator_type *)(puVar2 + 2),(item *)path);
    operator_delete(puVar2);
  }
  p_Var6 = (pointer)operator_new(0x230);
  local_30._M_alloc =
       (allocator<std::_List_node<ev3dev::(anonymous_namespace)::lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_ofstream<char,_std::char_traits<char>_>_>::item>_>
        *)&DAT_0011dbb8;
  local_30._M_ptr = p_Var6;
  std::__cxx11::string::string((string *)&p_Var6->_M_storage,(string *)this);
  std::ofstream::ofstream((p_Var6->_M_storage)._M_storage + 0x20);
  local_30._M_ptr = (pointer)0x0;
  std::
  __allocated_ptr<std::allocator<std::_List_node<ev3dev::(anonymous_namespace)::lru_cache<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::basic_ofstream<char,_std::char_traits<char>_>_>::item>_>_>
  ::~__allocated_ptr(&local_30);
  std::__detail::_List_node_base::_M_hook((_List_node_base *)p_Var6);
  DAT_0011dbc8 = DAT_0011dbc8 + 1;
  goto LAB_001107bc;
}

Assistant:

std::ofstream &ofstream_open(const std::string &path) {
    std::ofstream &file = ofstream_cache(path);
    if (!file.is_open()) {
        // Don't buffer writes to avoid latency. Also saves a bit of memory.
        file.rdbuf()->pubsetbuf(NULL, 0);
        file.open(path);
    } else {
        // Clear the error bits in case something happened.
        file.clear();
    }
    return file;
}